

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr htmlDoRead(htmlParserCtxtPtr ctxt,char *URL,char *encoding,int options,int reuse)

{
  htmlDocPtr pxVar1;
  xmlCharEncodingHandlerPtr handler;
  xmlChar *pxVar2;
  xmlCharEncodingHandlerPtr hdlr;
  htmlDocPtr ret;
  int reuse_local;
  int options_local;
  char *encoding_local;
  char *URL_local;
  htmlParserCtxtPtr ctxt_local;
  
  htmlCtxtUseOptions(ctxt,options);
  ctxt->html = 1;
  if ((encoding != (char *)0x0) &&
     (handler = xmlFindCharEncodingHandler(encoding), handler != (xmlCharEncodingHandlerPtr)0x0)) {
    xmlSwitchToEncoding(ctxt,handler);
    if (ctxt->input->encoding != (xmlChar *)0x0) {
      (*xmlFree)(ctxt->input->encoding);
    }
    pxVar2 = xmlStrdup((xmlChar *)encoding);
    ctxt->input->encoding = pxVar2;
  }
  if (((URL != (char *)0x0) && (ctxt->input != (xmlParserInputPtr)0x0)) &&
     (ctxt->input->filename == (char *)0x0)) {
    pxVar2 = xmlStrdup((xmlChar *)URL);
    ctxt->input->filename = (char *)pxVar2;
  }
  htmlParseDocument(ctxt);
  pxVar1 = ctxt->myDoc;
  ctxt->myDoc = (xmlDocPtr)0x0;
  if (reuse == 0) {
    if (((ctxt->dictNames != 0) && (pxVar1 != (htmlDocPtr)0x0)) && (pxVar1->dict == ctxt->dict)) {
      ctxt->dict = (xmlDictPtr)0x0;
    }
    xmlFreeParserCtxt(ctxt);
  }
  return pxVar1;
}

Assistant:

static htmlDocPtr
htmlDoRead(htmlParserCtxtPtr ctxt, const char *URL, const char *encoding,
          int options, int reuse)
{
    htmlDocPtr ret;

    htmlCtxtUseOptions(ctxt, options);
    ctxt->html = 1;
    if (encoding != NULL) {
        xmlCharEncodingHandlerPtr hdlr;

	hdlr = xmlFindCharEncodingHandler(encoding);
	if (hdlr != NULL) {
	    xmlSwitchToEncoding(ctxt, hdlr);
	    if (ctxt->input->encoding != NULL)
	      xmlFree((xmlChar *) ctxt->input->encoding);
            ctxt->input->encoding = xmlStrdup((xmlChar *)encoding);
        }
    }
    if ((URL != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->filename == NULL))
        ctxt->input->filename = (char *) xmlStrdup((const xmlChar *) URL);
    htmlParseDocument(ctxt);
    ret = ctxt->myDoc;
    ctxt->myDoc = NULL;
    if (!reuse) {
        if ((ctxt->dictNames) &&
	    (ret != NULL) &&
	    (ret->dict == ctxt->dict))
	    ctxt->dict = NULL;
	xmlFreeParserCtxt(ctxt);
    }
    return (ret);
}